

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

void Fxch_ManUpdate(Fxch_Man_t *pFxchMan,int iDiv)

{
  byte *pbVar1;
  int *piVar2;
  long lVar3;
  Hsh_VecMan_t *pHVar4;
  Vec_Wec_t *pVVar5;
  Vec_Wec_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  Vec_Int_t *pVVar14;
  Vec_Int_t *pVVar15;
  Vec_Int_t *pVVar16;
  Vec_Int_t *pVVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  int *piVar26;
  long lVar27;
  uint uVar28;
  int *piVar29;
  long lVar30;
  int *piVar31;
  int *piVar32;
  bool bVar33;
  
  pVVar15 = pFxchMan->vDiv;
  pVVar15->nSize = 0;
  if (iDiv < 0) {
LAB_004c8706:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pHVar4 = pFxchMan->pDivHash;
  if (pHVar4->vMap->nSize <= iDiv) goto LAB_004c8706;
  iVar10 = pHVar4->vMap->pArray[(uint)iDiv];
  if (((long)iVar10 < 0) || (pHVar4->vData->nSize <= iVar10)) {
LAB_004c8744:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar7 = pHVar4->vData->pArray + iVar10;
  iVar10 = *piVar7;
  (pHVar4->vTemp).nCap = iVar10;
  (pHVar4->vTemp).nSize = iVar10;
  (pHVar4->vTemp).pArray = piVar7 + 2;
  if (0 < iVar10) {
    lVar30 = 0;
    do {
      Vec_IntPush(pVVar15,(pHVar4->vTemp).pArray[lVar30]);
      lVar30 = lVar30 + 1;
    } while (lVar30 < (pHVar4->vTemp).nSize);
    pVVar15 = pFxchMan->vDiv;
  }
  pVVar14 = pFxchMan->vCubesS;
  pVVar14->nSize = 0;
  uVar24 = 0xffffffff;
  uVar20 = 0xffffffff;
  if (pVVar15->nSize == 2) {
    uVar20 = *pVVar15->pArray;
    if (((int)uVar20 < 0) || (uVar24 = pVVar15->pArray[1], (int)uVar24 < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar20 = uVar20 >> 1;
    pVVar5 = pFxchMan->vLits;
    uVar19 = (ulong)uVar20 ^ 1;
    if (pVVar5->nSize <= (int)uVar19) goto LAB_004c86e7;
    pVVar6 = pFxchMan->vCubes;
    pVVar15 = pVVar5->pArray;
    uVar11 = pVVar15[uVar19].nSize;
    if ((int)uVar11 < 1) {
      uVar21 = 0;
    }
    else {
      piVar7 = pVVar15[uVar19].pArray;
      lVar30 = 0;
      uVar21 = 0;
      do {
        iVar10 = piVar7[lVar30];
        if (((long)iVar10 < 0) || (pVVar6->nSize <= iVar10)) goto LAB_004c86e7;
        if (0 < pVVar6->pArray[iVar10].nSize) {
          if (((int)uVar21 < 0) || (uVar11 <= uVar21)) goto LAB_004c87a1;
          uVar22 = (ulong)uVar21;
          uVar21 = uVar21 + 1;
          piVar7[uVar22] = iVar10;
          uVar11 = pVVar15[uVar19].nSize;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 < (int)uVar11);
    }
    if ((int)uVar11 < (int)uVar21) goto LAB_004c87fe;
    uVar24 = uVar24 >> 1;
    pVVar15[uVar19].nSize = uVar21;
    uVar22 = (ulong)uVar24 ^ 1;
    if (pVVar5->nSize <= (int)uVar22) goto LAB_004c86e7;
    uVar11 = pVVar15[uVar22].nSize;
    if ((int)uVar11 < 1) {
      uVar21 = 0;
    }
    else {
      piVar7 = pVVar15[uVar22].pArray;
      lVar30 = 0;
      uVar21 = 0;
      do {
        iVar10 = piVar7[lVar30];
        if (((long)iVar10 < 0) || (pVVar6->nSize <= iVar10)) goto LAB_004c86e7;
        if (0 < pVVar6->pArray[iVar10].nSize) {
          if (((int)uVar21 < 0) || (uVar11 <= uVar21)) {
LAB_004c87a1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar25 = (ulong)uVar21;
          uVar21 = uVar21 + 1;
          piVar7[uVar25] = iVar10;
          uVar11 = pVVar15[uVar22].nSize;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 < (int)uVar11);
    }
    if ((int)uVar11 < (int)uVar21) goto LAB_004c87fe;
    pVVar15[uVar22].nSize = uVar21;
    if ((pVVar5->nSize <= (int)uVar19) || (pVVar5->nSize <= (int)uVar22)) goto LAB_004c86e7;
    piVar31 = pVVar15[uVar19].pArray;
    piVar26 = pVVar15[uVar22].pArray;
    iVar10 = pVVar15[uVar19].nSize;
    piVar7 = piVar31 + iVar10;
    piVar2 = piVar26 + (int)uVar21;
    pVVar14->nSize = 0;
    piVar29 = piVar26;
    piVar32 = piVar31;
    if ((0 < (int)uVar21) && (0 < iVar10)) {
      do {
        iVar10 = *piVar31;
        iVar9 = *piVar29;
        if (iVar10 == iVar9) {
          Vec_IntPush(pVVar14,iVar10);
          piVar31 = piVar31 + 1;
          piVar29 = piVar29 + 1;
        }
        else if (iVar10 < iVar9) {
          piVar31 = piVar31 + 1;
          *piVar32 = iVar10;
          piVar32 = piVar32 + 1;
        }
        else {
          piVar29 = piVar29 + 1;
          *piVar26 = iVar9;
          piVar26 = piVar26 + 1;
        }
      } while ((piVar31 < piVar7) && (piVar29 < piVar2));
    }
    for (; piVar31 < piVar7; piVar31 = piVar31 + 1) {
      *piVar32 = *piVar31;
      piVar32 = piVar32 + 1;
    }
    for (; piVar29 < piVar2; piVar29 = piVar29 + 1) {
      *piVar26 = *piVar29;
      piVar26 = piVar26 + 1;
    }
    iVar10 = (int)((ulong)((long)piVar32 - (long)pVVar15[uVar19].pArray) >> 2);
    if (pVVar15[uVar19].nSize < iVar10) {
LAB_004c87fe:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    pVVar15[uVar19].nSize = iVar10;
    iVar10 = (int)((ulong)((long)piVar26 - (long)pVVar15[uVar22].pArray) >> 2);
    if (pVVar15[uVar22].nSize < iVar10) goto LAB_004c87fe;
    pVVar15[uVar22].nSize = iVar10;
  }
  pVVar15 = pFxchMan->vPairs;
  pVVar15->nSize = 0;
  if (pFxchMan->vDivCubePairs->nSize <= iDiv) {
LAB_004c86e7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar17 = pFxchMan->vDivCubePairs->pArray;
  pVVar14 = pVVar17 + (uint)iDiv;
  if (0 < pVVar17[(uint)iDiv].nSize) {
    lVar30 = 0;
    do {
      Vec_IntPush(pVVar15,pVVar14->pArray[lVar30]);
      lVar30 = lVar30 + 1;
    } while (lVar30 < pVVar14->nSize);
  }
  if (pVVar14->pArray != (int *)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (int *)0x0;
  }
  pVVar14->nCap = 0;
  pVVar14->nSize = 0;
  pVVar15 = pFxchMan->vPairs;
  uVar11 = pVVar15->nSize;
  if (1 < (int)uVar11) {
    lVar30 = 0;
    do {
      uVar11 = pVVar15->pArray[lVar30];
      lVar27 = (long)(int)uVar11;
      if (lVar27 < 0) goto LAB_004c86e7;
      uVar21 = pFxchMan->vCubes->nSize;
      if ((int)uVar21 <= (int)uVar11) goto LAB_004c86e7;
      pVVar14 = pFxchMan->vCubes->pArray;
      if (pVVar14[lVar27].nSize < 1) goto LAB_004c8706;
      uVar28 = pVVar15->pArray[lVar30 + 1];
      if (((int)uVar28 < 0) || (uVar21 <= uVar28)) goto LAB_004c86e7;
      if (pVVar14[uVar28].nSize < 1) goto LAB_004c8706;
      if (*pVVar14[lVar27].pArray != *pVVar14[uVar28].pArray) {
        __assert_fail("Fxch_ManGetLit( pFxchMan, iCube0, 0) == Fxch_ManGetLit( pFxchMan, iCube1, 0)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                      ,0x26f,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
      }
      iVar10 = (int)lVar30;
      if (uVar28 < uVar11) {
        Vec_IntSetEntry(pVVar15,iVar10,uVar28);
        Vec_IntSetEntry(pFxchMan->vPairs,iVar10 + 1,uVar11);
        pVVar15 = pFxchMan->vPairs;
      }
      lVar30 = lVar30 + 2;
      uVar11 = pVVar15->nSize;
    } while (iVar10 + 3 < (int)uVar11);
  }
  if ((uVar11 & 1) != 0) {
LAB_004c881d:
    __assert_fail("p->nSize % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x5da,"int Vec_IntUniqifyPairs(Vec_Int_t *)");
  }
  if (3 < (int)uVar11) {
    qsort(pVVar15->pArray,(ulong)(uVar11 >> 1),8,Vec_IntSortCompare1);
    iVar10 = pVVar15->nSize;
    iVar9 = 2;
    if (3 < iVar10) {
      piVar7 = pVVar15->pArray;
      iVar9 = 1;
      lVar30 = 1;
      do {
        iVar12 = piVar7[lVar30 * 2 + 1];
        if ((piVar7[lVar30 * 2] != piVar7[lVar30 * 2 + -2]) || (iVar12 != piVar7[lVar30 * 2 + -1]))
        {
          piVar7[iVar9 * 2] = piVar7[lVar30 * 2];
          piVar7[iVar9 * 2 + 1] = iVar12;
          iVar9 = iVar9 + 1;
          iVar10 = pVVar15->nSize;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 < iVar10 / 2);
      iVar9 = iVar9 * 2;
    }
    pVVar15->nSize = iVar9;
    pVVar15 = pFxchMan->vPairs;
    uVar11 = pVVar15->nSize;
  }
  if ((uVar11 & 1) != 0) {
    __assert_fail("Vec_IntSize( pFxchMan->vPairs ) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                  ,0x278,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  pVVar14 = pFxchMan->vCubesS;
  if (0 < pVVar14->nSize) {
    lVar30 = 0;
    do {
      iVar10 = pVVar14->pArray[lVar30];
      lVar27 = (long)iVar10;
      Fxch_ManDivSingleCube(pFxchMan,iVar10,0,1);
      if ((lVar27 < 0) || (pFxchMan->vCubes->nSize <= iVar10)) goto LAB_004c86e7;
      pVVar15 = pFxchMan->vCubes->pArray;
      if (pVVar15[lVar27].nSize < 1) goto LAB_004c8706;
      if (*pVVar15[lVar27].pArray == 0) {
        Fxch_ManDivDoubleCube(pFxchMan,iVar10,0,1);
      }
      lVar30 = lVar30 + 1;
      pVVar14 = pFxchMan->vCubesS;
    } while (lVar30 < pVVar14->nSize);
    pVVar15 = pFxchMan->vPairs;
    uVar11 = pVVar15->nSize;
  }
  if (0 < (int)uVar11) {
    lVar30 = 0;
    do {
      iVar10 = pVVar15->pArray[lVar30];
      lVar27 = (long)iVar10;
      Fxch_ManDivSingleCube(pFxchMan,iVar10,0,1);
      if ((lVar27 < 0) || (pFxchMan->vCubes->nSize <= iVar10)) goto LAB_004c86e7;
      pVVar15 = pFxchMan->vCubes->pArray;
      if (pVVar15[lVar27].nSize < 1) goto LAB_004c8706;
      if (*pVVar15[lVar27].pArray == 0) {
        Fxch_ManDivDoubleCube(pFxchMan,iVar10,0,1);
      }
      lVar30 = lVar30 + 1;
      pVVar15 = pFxchMan->vPairs;
    } while (lVar30 < pVVar15->nSize);
  }
  pFxchMan->vCubesToUpdate->nSize = 0;
  iVar10 = Fxch_DivIsNotConstant1(pFxchMan->vDiv);
  if (iVar10 == 0) {
    iVar10 = 0;
  }
  else {
    iVar10 = pFxchMan->nVars;
    pFxchMan->nVars = iVar10 + 1;
    if (0 < pFxchMan->nSizeOutputID) {
      piVar7 = pFxchMan->pTempOutputID;
      lVar30 = 0;
      do {
        piVar7[lVar30] = 0;
        lVar30 = lVar30 + 1;
      } while (lVar30 < pFxchMan->nSizeOutputID);
    }
    pVVar15 = pFxchMan->vLitHashKeys;
    uVar11 = Gia_ManRandom(0);
    Vec_IntPush(pVVar15,uVar11 & 0x3ffffff);
    pVVar15 = pFxchMan->vLitHashKeys;
    uVar11 = Gia_ManRandom(0);
    Vec_IntPush(pVVar15,uVar11 & 0x3ffffff);
    pVVar15 = Vec_WecPushLevel(pFxchMan->vCubes);
    Vec_IntPush(pVVar15,iVar10);
    iVar9 = pFxchMan->nSizeOutputID;
    if (0 < (long)iVar9) {
      pVVar14 = pFxchMan->vOutputID;
      piVar7 = pFxchMan->pTempOutputID;
      lVar30 = 0;
      do {
        Vec_IntPush(pVVar14,piVar7[lVar30]);
        lVar30 = lVar30 + 1;
      } while (iVar9 != lVar30);
    }
    if (pFxchMan->vDiv->nSize == 2) {
      uVar11 = uVar24;
      if ((int)uVar20 < (int)uVar24) {
        uVar11 = uVar20;
      }
      if ((int)uVar11 < 0) {
LAB_004c8763:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      uVar21 = uVar24;
      if ((int)uVar24 < (int)uVar20) {
        uVar21 = uVar20;
      }
      Vec_IntPush(pVVar15,uVar11 ^ 1);
      Vec_IntPush(pVVar15,uVar21 ^ 1);
      iVar9 = Fxch_ManComputeLevelCube(pFxchMan,pVVar15);
      iVar9 = iVar9 + 1;
    }
    else {
      pVVar15 = Vec_WecPushLevel(pFxchMan->vCubes);
      Vec_IntPush(pVVar15,iVar10);
      iVar9 = pFxchMan->nSizeOutputID;
      if (0 < (long)iVar9) {
        pVVar14 = pFxchMan->vOutputID;
        piVar7 = pFxchMan->pTempOutputID;
        lVar30 = 0;
        do {
          Vec_IntPush(pVVar14,piVar7[lVar30]);
          lVar30 = lVar30 + 1;
        } while (iVar9 != lVar30);
      }
      lVar30 = (long)pFxchMan->vCubes->nSize;
      if (lVar30 < 2) goto LAB_004c86e7;
      pVVar14 = pFxchMan->vCubes->pArray;
      pVVar17 = pVVar14 + lVar30 + -2;
      Fxch_DivSepareteCubes(pFxchMan->vDiv,pVVar17,pVVar15);
      iVar12 = Fxch_ManComputeLevelCube(pFxchMan,pVVar17);
      iVar9 = Fxch_ManComputeLevelCube(pFxchMan,pVVar15);
      if (iVar9 < iVar12) {
        iVar9 = iVar12;
      }
      pVVar8 = pFxchMan->vCubes->pArray;
      if ((pVVar17 < pVVar8) || (pVVar8 + pFxchMan->vCubes->nSize <= pVVar17)) {
LAB_004c8725:
        __assert_fail("p->pArray <= vLevel && vLevel < p->pArray + p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0xba,"int Vec_WecLevelId(Vec_Wec_t *, Vec_Int_t *)");
      }
      Vec_IntPush(pFxchMan->vCubesToUpdate,(int)((ulong)((long)pVVar17 - (long)pVVar8) >> 4));
      pVVar8 = pFxchMan->vCubes->pArray;
      if ((pVVar15 < pVVar8) || (pVVar8 + pFxchMan->vCubes->nSize <= pVVar15)) goto LAB_004c8725;
      Vec_IntPush(pFxchMan->vCubesToUpdate,(int)((ulong)((long)pVVar15 - (long)pVVar8) >> 4));
      if (1 < pVVar14[lVar30 + -2].nSize) {
        lVar27 = 1;
        do {
          pVVar8 = pFxchMan->vCubes->pArray;
          if ((pVVar17 < pVVar8) || (pVVar8 + pFxchMan->vCubes->nSize <= pVVar17))
          goto LAB_004c8725;
          uVar11 = pVVar14[lVar30 + -2].pArray[lVar27];
          pVVar5 = pFxchMan->vLits;
          iVar12 = pVVar5->nSize;
          if (iVar12 <= (int)uVar11) {
            iVar13 = uVar11 + 1;
            iVar18 = iVar12 * 2;
            if (iVar12 * 2 <= iVar13) {
              iVar18 = iVar13;
            }
            iVar12 = pVVar5->nCap;
            if (iVar12 < iVar18) {
              if (pVVar5->pArray == (Vec_Int_t *)0x0) {
                pVVar16 = (Vec_Int_t *)malloc((long)iVar18 << 4);
              }
              else {
                pVVar16 = (Vec_Int_t *)realloc(pVVar5->pArray,(long)iVar18 << 4);
                iVar12 = pVVar5->nCap;
              }
              pVVar5->pArray = pVVar16;
              memset(pVVar16 + iVar12,0,(long)(iVar18 - iVar12) << 4);
              pVVar5->nCap = iVar18;
            }
            pVVar5->nSize = iVar13;
            iVar12 = iVar13;
          }
          if (((int)uVar11 < 0) || (iVar12 <= (int)uVar11)) goto LAB_004c86e7;
          Vec_IntPush(pVVar5->pArray + uVar11,(int)((ulong)((long)pVVar17 - (long)pVVar8) >> 4));
          lVar27 = lVar27 + 1;
        } while (lVar27 < pVVar14[lVar30 + -2].nSize);
      }
      iVar9 = iVar9 + 2;
      if (1 < pVVar15->nSize) {
        lVar30 = 1;
        do {
          pVVar14 = pFxchMan->vCubes->pArray;
          if ((pVVar15 < pVVar14) || (pVVar14 + pFxchMan->vCubes->nSize <= pVVar15))
          goto LAB_004c8725;
          uVar11 = pVVar15->pArray[lVar30];
          pVVar5 = pFxchMan->vLits;
          iVar12 = pVVar5->nSize;
          if (iVar12 <= (int)uVar11) {
            iVar13 = uVar11 + 1;
            iVar18 = iVar12 * 2;
            if (iVar12 * 2 <= iVar13) {
              iVar18 = iVar13;
            }
            iVar12 = pVVar5->nCap;
            if (iVar12 < iVar18) {
              if (pVVar5->pArray == (Vec_Int_t *)0x0) {
                pVVar17 = (Vec_Int_t *)malloc((long)iVar18 << 4);
              }
              else {
                pVVar17 = (Vec_Int_t *)realloc(pVVar5->pArray,(long)iVar18 << 4);
                iVar12 = pVVar5->nCap;
              }
              pVVar5->pArray = pVVar17;
              memset(pVVar17 + iVar12,0,(long)(iVar18 - iVar12) << 4);
              pVVar5->nCap = iVar18;
            }
            pVVar5->nSize = iVar13;
            iVar12 = iVar13;
          }
          if (((int)uVar11 < 0) || (iVar12 <= (int)uVar11)) goto LAB_004c86e7;
          Vec_IntPush(pVVar5->pArray + uVar11,(int)((ulong)((long)pVVar15 - (long)pVVar14) >> 4));
          lVar30 = lVar30 + 1;
        } while (lVar30 < pVVar15->nSize);
      }
    }
    if (pFxchMan->vLevels->nSize != iVar10) {
      __assert_fail("Vec_IntSize( pFxchMan->vLevels ) == iVarNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x23c,"int Fxch_ManCreateCube(Fxch_Man_t *, int, int)");
    }
    Vec_IntPush(pFxchMan->vLevels,iVar9);
    pFxchMan->nLits = pFxchMan->nLits + pFxchMan->vDiv->nSize;
    Vec_WecPushLevel(pFxchMan->vLits);
    Vec_WecPushLevel(pFxchMan->vLits);
    lVar30 = (long)pFxchMan->vLits->nSize;
    if (lVar30 < 2) goto LAB_004c86e7;
    pVVar15 = pFxchMan->vCubesS;
    if (0 < pVVar15->nSize) {
      pVVar14 = pFxchMan->vLits->pArray;
      lVar27 = 0;
      do {
        iVar9 = pVVar15->pArray[lVar27];
        if (((long)iVar9 < 0) || (pFxchMan->vCubes->nSize <= iVar9)) goto LAB_004c86e7;
        if ((int)uVar20 < 0) goto LAB_004c8763;
        pVVar15 = pFxchMan->vCubes->pArray + iVar9;
        iVar12 = pVVar15->nSize;
        uVar19 = (ulong)iVar12;
        iVar18 = 0;
        if (1 < (long)uVar19) {
          piVar7 = pVVar15->pArray;
          uVar22 = 2;
LAB_004c8168:
          if ((piVar7[uVar22 - 1] ^ uVar20) != 1) goto code_r0x004c8176;
          if ((int)uVar22 < iVar12) {
            do {
              piVar7[uVar22 - 1] = piVar7[uVar22];
              uVar22 = uVar22 + 1;
              iVar12 = pVVar15->nSize;
            } while ((int)uVar22 < iVar12);
          }
          uVar19 = (ulong)(iVar12 - 1U);
          pVVar15->nSize = iVar12 - 1U;
          iVar18 = 1;
        }
LAB_004c81a9:
        iVar12 = (int)uVar19;
        if ((int)uVar24 < 0) goto LAB_004c8763;
        iVar13 = 0;
        if (1 < iVar12) {
          piVar7 = pVVar15->pArray;
          lVar23 = 2;
LAB_004c81cd:
          if ((piVar7[lVar23 + -1] ^ uVar24) != 1) goto code_r0x004c81db;
          if ((int)lVar23 < iVar12) {
            do {
              piVar7[lVar23 + -1] = piVar7[lVar23];
              lVar23 = lVar23 + 1;
              iVar12 = pVVar15->nSize;
            } while ((int)lVar23 < iVar12);
          }
          pVVar15->nSize = iVar12 + -1;
          iVar13 = 1;
        }
LAB_004c820e:
        if (iVar13 + iVar18 != 2) {
          __assert_fail("RetValue == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                        ,0x179,
                        "void Fxch_ManExtractDivFromCube(Fxch_Man_t *, const int, const int, const int)"
                       );
        }
        if (iVar10 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(pVVar15,iVar10 * 2);
        pVVar17 = pFxchMan->vCubes->pArray;
        if ((pVVar15 < pVVar17) || (pVVar17 + pFxchMan->vCubes->nSize <= pVVar15))
        goto LAB_004c8725;
        Vec_IntPush(pVVar14 + lVar30 + -2,(int)((ulong)((long)pVVar15 - (long)pVVar17) >> 4));
        Vec_IntPush(pFxchMan->vCubesToUpdate,iVar9);
        pFxchMan->nLits = pFxchMan->nLits + -1;
        lVar27 = lVar27 + 1;
        pVVar15 = pFxchMan->vCubesS;
      } while (lVar27 < pVVar15->nSize);
    }
  }
  Fxch_ManExtractDivFromCubePairs(pFxchMan,iVar10);
  pVVar15 = pFxchMan->vCubesToUpdate;
  if (pVVar15->nSize == 0) {
    __assert_fail("Vec_IntSize( pFxchMan->vCubesToUpdate )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                  ,0x295,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  if (0 < pVVar15->nSize) {
    lVar30 = 0;
    do {
      iVar10 = pVVar15->pArray[lVar30];
      lVar27 = (long)iVar10;
      Fxch_ManDivSingleCube(pFxchMan,iVar10,1,1);
      if ((lVar27 < 0) || (pFxchMan->vCubes->nSize <= iVar10)) goto LAB_004c86e7;
      pVVar15 = pFxchMan->vCubes->pArray;
      if (pVVar15[lVar27].nSize < 1) goto LAB_004c8706;
      if (*pVVar15[lVar27].pArray == 0) {
        Fxch_ManDivDoubleCube(pFxchMan,iVar10,1,1);
      }
      lVar30 = lVar30 + 1;
      pVVar15 = pFxchMan->vCubesToUpdate;
    } while (lVar30 < pVVar15->nSize);
  }
  pVVar15 = pFxchMan->vSCC;
  uVar20 = pVVar15->nSize;
  if (uVar20 != 0) {
    if ((uVar20 & 1) != 0) goto LAB_004c881d;
    if (3 < (int)uVar20) {
      qsort(pVVar15->pArray,(ulong)(uVar20 >> 1),8,Vec_IntSortCompare1);
      iVar10 = pVVar15->nSize;
      iVar9 = 2;
      if (3 < iVar10) {
        piVar7 = pVVar15->pArray;
        iVar9 = 1;
        lVar30 = 1;
        do {
          iVar12 = piVar7[lVar30 * 2 + 1];
          if ((piVar7[lVar30 * 2] != piVar7[lVar30 * 2 + -2]) || (iVar12 != piVar7[lVar30 * 2 + -1])
             ) {
            piVar7[iVar9 * 2] = piVar7[lVar30 * 2];
            piVar7[iVar9 * 2 + 1] = iVar12;
            iVar9 = iVar9 + 1;
            iVar10 = pVVar15->nSize;
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 < iVar10 / 2);
        iVar9 = iVar9 * 2;
      }
      pVVar15->nSize = iVar9;
      pVVar15 = pFxchMan->vSCC;
      uVar20 = pVVar15->nSize;
    }
    if ((uVar20 & 1) != 0) {
      __assert_fail("Vec_IntSize( pFxchMan->vSCC ) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x2a4,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
    }
    if (1 < (int)uVar20) {
      uVar19 = (ulong)(uint)pFxchMan->nSizeOutputID;
      lVar30 = 0;
      do {
        uVar20 = pVVar15->pArray[lVar30];
        uVar24 = uVar20 * (int)uVar19;
        if ((int)uVar24 < 0) goto LAB_004c8744;
        uVar11 = pFxchMan->vOutputID->nSize;
        if ((int)uVar11 <= (int)uVar24) goto LAB_004c8744;
        uVar21 = pVVar15->pArray[lVar30 + 1];
        uVar28 = (int)uVar19 * uVar21;
        if (((int)uVar28 < 0) || (uVar11 <= uVar28)) goto LAB_004c8744;
        if ((int)uVar20 < 0) goto LAB_004c86e7;
        uVar11 = pFxchMan->vCubes->nSize;
        if ((((int)uVar11 <= (int)uVar20) || ((int)uVar21 < 0)) || (uVar11 <= uVar21))
        goto LAB_004c86e7;
        piVar7 = pFxchMan->vOutputID->pArray;
        pVVar15 = pFxchMan->vCubes->pArray;
        if ((pVVar15[uVar20].nCap & 0x40000000) == 0) {
          Fxch_ManDivSingleCube(pFxchMan,uVar20,0,1);
          Fxch_ManDivDoubleCube(pFxchMan,uVar20,0,1);
          pbVar1 = (byte *)((long)&pVVar15[uVar20].nCap + 3);
          *pbVar1 = *pbVar1 | 0x40;
        }
        if ((pVVar15[uVar21].nCap & 0x40000000) == 0) {
          Fxch_ManDivSingleCube(pFxchMan,uVar21,0,1);
          Fxch_ManDivDoubleCube(pFxchMan,uVar21,0,1);
          pbVar1 = (byte *)((long)&pVVar15[uVar21].nCap + 3);
          *pbVar1 = *pbVar1 | 0x40;
        }
        uVar11 = pFxchMan->nSizeOutputID;
        uVar19 = (ulong)uVar11;
        if (pVVar15[uVar20].nSize == pVVar15[uVar21].nSize) {
          if (0 < (int)uVar11) {
            lVar27 = 0;
            do {
              piVar7[(ulong)uVar28 + lVar27] =
                   piVar7[(ulong)uVar28 + lVar27] | piVar7[(ulong)uVar24 + lVar27];
              piVar7[(ulong)uVar24 + lVar27] = 0;
              lVar27 = lVar27 + 1;
              uVar19 = (ulong)pFxchMan->nSizeOutputID;
            } while (lVar27 < (long)uVar19);
          }
LAB_004c85ab:
          if (pFxchMan->vCubes->nSize <= (int)uVar20) goto LAB_004c86e7;
          pFxchMan->vCubes->pArray[uVar20].nSize = 0;
          pbVar1 = (byte *)((long)&pVVar15[uVar20].nCap + 3);
          *pbVar1 = *pbVar1 ^ 0x40;
        }
        else {
          if ((int)uVar11 < 1) goto LAB_004c85ab;
          uVar22 = 1;
          do {
            lVar27 = uVar22 - 1;
            lVar23 = uVar22 - 1;
            if (uVar19 <= uVar22) break;
            uVar22 = uVar22 + 1;
          } while (piVar7[(ulong)uVar24 + lVar27] == piVar7[(ulong)uVar28 + lVar23]);
          if (piVar7[(ulong)uVar24 + lVar27] == piVar7[(ulong)uVar28 + lVar23]) goto LAB_004c85ab;
          lVar27 = 0;
          uVar11 = 0;
          do {
            uVar11 = uVar11 | ~piVar7[(ulong)uVar28 + lVar27] & piVar7[(ulong)uVar24 + lVar27];
            piVar7[(ulong)uVar24 + lVar27] =
                 ~piVar7[(ulong)uVar28 + lVar27] & piVar7[(ulong)uVar24 + lVar27];
            lVar27 = lVar27 + 1;
            uVar19 = (ulong)pFxchMan->nSizeOutputID;
          } while (lVar27 < (long)uVar19);
          if (uVar11 == 0) goto LAB_004c85ab;
        }
        lVar30 = lVar30 + 2;
        pVVar15 = pFxchMan->vSCC;
      } while ((int)((uint)lVar30 | 1) < pVVar15->nSize);
      if (1 < pVVar15->nSize) {
        lVar30 = 1;
        do {
          iVar10 = pVVar15->pArray[lVar30 + -1];
          lVar27 = (long)iVar10;
          if (lVar27 < 0) goto LAB_004c86e7;
          uVar20 = pFxchMan->vCubes->nSize;
          if ((((int)uVar20 <= iVar10) || (uVar24 = pVVar15->pArray[lVar30], (int)uVar24 < 0)) ||
             (uVar20 <= uVar24)) goto LAB_004c86e7;
          pVVar15 = pFxchMan->vCubes->pArray;
          if ((pVVar15[lVar27].nCap & 0x40000000) != 0) {
            Fxch_ManDivSingleCube(pFxchMan,iVar10,1,1);
            Fxch_ManDivDoubleCube(pFxchMan,iVar10,1,1);
            pbVar1 = (byte *)((long)&pVVar15[lVar27].nCap + 3);
            *pbVar1 = *pbVar1 ^ 0x40;
          }
          if ((pVVar15[uVar24].nCap & 0x40000000) != 0) {
            Fxch_ManDivSingleCube(pFxchMan,uVar24,1,1);
            Fxch_ManDivDoubleCube(pFxchMan,uVar24,1,1);
            pbVar1 = (byte *)((long)&pVVar15[uVar24].nCap + 3);
            *pbVar1 = *pbVar1 ^ 0x40;
          }
          pVVar15 = pFxchMan->vSCC;
          lVar30 = lVar30 + 2;
        } while ((int)lVar30 < pVVar15->nSize);
      }
    }
    pVVar15->nSize = 0;
  }
  pFxchMan->nExtDivs = pFxchMan->nExtDivs + 1;
  return;
code_r0x004c8176:
  bVar33 = uVar22 == uVar19;
  uVar22 = uVar22 + 1;
  iVar18 = 0;
  if (bVar33) goto LAB_004c81a9;
  goto LAB_004c8168;
code_r0x004c81db:
  lVar3 = (1 - (uVar19 & 0xffffffff)) + lVar23;
  lVar23 = lVar23 + 1;
  if (lVar3 == 1) goto LAB_004c820e;
  goto LAB_004c81cd;
}

Assistant:

void Fxch_ManUpdate( Fxch_Man_t* pFxchMan,
                     int iDiv )
{
    int i, iCube0, iCube1,
        Lit0 = -1,
        Lit1 = -1,
        iVarNew;

    Vec_Int_t* vCube0,
             * vCube1,
             * vDivCubePairs;

    /* Get the selected candidate (divisor) */
    Vec_IntClear( pFxchMan->vDiv );
    Vec_IntAppend( pFxchMan->vDiv, Hsh_VecReadEntry( pFxchMan->pDivHash, iDiv ) );

    /* Find cubes associated with the divisor */
    Vec_IntClear( pFxchMan->vCubesS );
    if ( Vec_IntSize( pFxchMan->vDiv ) == 2 )
    {
        Lit0 = Abc_Lit2Var( Vec_IntEntry( pFxchMan->vDiv, 0 ) );
        Lit1 = Abc_Lit2Var( Vec_IntEntry( pFxchMan->vDiv, 1 ) );
        assert( Lit0 >= 0 && Lit1 >= 0 );

        Fxch_ManCompressCubes( pFxchMan->vCubes, Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit0 ) ) );
        Fxch_ManCompressCubes( pFxchMan->vCubes, Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit1 ) ) );
        Vec_IntTwoRemoveCommon( Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit0 ) ),
                                Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit1 ) ),
                                pFxchMan->vCubesS );
    }

    /* Find pairs associated with the divisor */
    Vec_IntClear( pFxchMan->vPairs );
    vDivCubePairs = Vec_WecEntry( pFxchMan->vDivCubePairs, iDiv );
    Vec_IntAppend( pFxchMan->vPairs, vDivCubePairs );
    Vec_IntErase( vDivCubePairs );

    Vec_IntForEachEntryDouble( pFxchMan->vPairs, iCube0, iCube1, i )
    {
        assert( Fxch_ManGetLit( pFxchMan, iCube0, 0) == Fxch_ManGetLit( pFxchMan, iCube1, 0) );
        if (iCube0 > iCube1)
        {
            Vec_IntSetEntry( pFxchMan->vPairs, i, iCube1);
            Vec_IntSetEntry( pFxchMan->vPairs, i+1, iCube0);
        }
    }

    Vec_IntUniqifyPairs( pFxchMan->vPairs );
    assert( Vec_IntSize( pFxchMan->vPairs ) % 2 == 0 );

    /* subtract cost of single-cube divisors */
    Vec_IntForEachEntry( pFxchMan->vCubesS, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1);

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
    }

    Vec_IntForEachEntry( pFxchMan->vPairs, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1);

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
    }

    Vec_IntClear( pFxchMan->vCubesToUpdate );
    if ( Fxch_DivIsNotConstant1( pFxchMan->vDiv ) )
    {
        iVarNew = Fxch_ManCreateCube( pFxchMan, Lit0, Lit1 );
        Fxch_ManExtractDivFromCube( pFxchMan, Lit0, Lit1, iVarNew );
        Fxch_ManExtractDivFromCubePairs( pFxchMan, iVarNew );
    }
    else
        Fxch_ManExtractDivFromCubePairs( pFxchMan, 0 );

    assert( Vec_IntSize( pFxchMan->vCubesToUpdate ) );

    /* Add cost */
    Vec_IntForEachEntry( pFxchMan->vCubesToUpdate, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 1, 1 );

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 1, 1 );
    }

    /* Deal with SCC */
    if ( Vec_IntSize( pFxchMan->vSCC ) )
    {
        Vec_IntUniqifyPairs( pFxchMan->vSCC );
        assert( Vec_IntSize( pFxchMan->vSCC ) % 2 == 0 );

        Vec_IntForEachEntryDouble( pFxchMan->vSCC, iCube0, iCube1, i )
        {
            int j, RetValue = 1;
            int* pOutputID0 = Vec_IntEntryP( pFxchMan->vOutputID, iCube0 * pFxchMan->nSizeOutputID );
            int* pOutputID1 = Vec_IntEntryP( pFxchMan->vOutputID, iCube1 * pFxchMan->nSizeOutputID );
            vCube0 = Vec_WecEntry( pFxchMan->vCubes, iCube0 );
            vCube1 = Vec_WecEntry( pFxchMan->vCubes, iCube1 );

            if ( !Vec_WecIntHasMark( vCube0 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
                Vec_WecIntSetMark( vCube0 );
            }

            if ( !Vec_WecIntHasMark( vCube1 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube1, 0, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube1, 0, 1 );
                Vec_WecIntSetMark( vCube1 );
            }

            if ( Vec_IntSize( vCube0 ) == Vec_IntSize( vCube1 ) )
            {
                for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                {
                    pOutputID1[j] |= pOutputID0[j];
                    pOutputID0[j] = 0;
                }
                Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                Vec_WecIntXorMark( vCube0 );
                continue;
            }

            for ( j = 0; j < pFxchMan->nSizeOutputID && RetValue; j++ )
                RetValue = ( pOutputID0[j] == pOutputID1[j] );

            if ( RetValue )
            {
                Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                Vec_WecIntXorMark( vCube0 );
            }
            else
            {
                RetValue = 0;
                for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                {
                    RetValue |= ( pOutputID0[j] & ~( pOutputID1[j] ) );
                    pOutputID0[j] &= ~( pOutputID1[j] );
                }

                if ( RetValue == 0 )
                {
                    Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                    Vec_WecIntXorMark( vCube0 );
                }
            }
        }

        Vec_IntForEachEntryDouble( pFxchMan->vSCC, iCube0, iCube1, i )
        {
            vCube0 = Vec_WecEntry( pFxchMan->vCubes, iCube0 );
            vCube1 = Vec_WecEntry( pFxchMan->vCubes, iCube1 );

            if ( Vec_WecIntHasMark( vCube0 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube0, 1, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube0, 1, 1 );
                Vec_WecIntXorMark( vCube0 );
            }

            if ( Vec_WecIntHasMark( vCube1 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube1, 1, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube1, 1, 1 );
                Vec_WecIntXorMark( vCube1 );
            }
        }

        Vec_IntClear( pFxchMan->vSCC );
    }

    pFxchMan->nExtDivs++;
}